

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

_Bool square_player_trap_allowed(chunk *c,loc grid)

{
  _Bool _Var1;
  object *poVar2;
  
  _Var1 = square_istrap((chunk_conflict *)c,grid);
  if (!_Var1) {
    poVar2 = square_object((chunk_conflict *)c,grid);
    if (poVar2 == (object *)0x0) {
      _Var1 = square_istrappable((chunk_conflict *)c,grid);
      return _Var1;
    }
  }
  return false;
}

Assistant:

bool square_player_trap_allowed(struct chunk *c, struct loc grid)
{

    /* We currently forbid multiple traps in a grid under normal conditions.
     * If this changes, various bits of code elsewhere will have to change too.
     */
    if (square_istrap(c, grid))
		return false;

    /* We currently forbid traps in a grid with objects. */
    if (square_object(c, grid))
		return false;

    /* Check it's a trappable square */
    return (square_istrappable(c, grid));
}